

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string_view bloaty::ReadUntil(string_view *data,char c)

{
  size_t __n;
  char *__s;
  void *pvVar1;
  undefined7 in_register_00000031;
  size_type __n_00;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  string_view sVar3;
  
  __n = data->_M_len;
  __s = data->_M_str;
  pvVar1 = memchr(__s,(int)CONCAT71(in_register_00000031,c),__n);
  __n_00 = (long)pvVar1 - (long)__s;
  if (pvVar1 == (void *)0x0) {
    __n_00 = __n;
  }
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr(data,0,__n_00);
  data->_M_str = data->_M_str + __n_00;
  data->_M_len = data->_M_len - __n_00;
  sVar3._M_len = bVar2._M_len;
  sVar3._M_str = bVar2._M_str;
  return sVar3;
}

Assistant:

std::string_view ReadUntil(std::string_view* data, char c) {
  const char* found =
      static_cast<const char*>(memchr(data->data(), c, data->size()));

  size_t len = (found == NULL) ? data->size() : (found - data->data());
  std::string_view val = data->substr(0, len);
  data->remove_prefix(len);
  return val;
}